

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestHangingTailCallee::foo(TestHangingTailCallee *this,FooContext context)

{
  PromiseArena *pPVar1;
  void *pvVar2;
  AttachmentPromiseNode<kj::_::Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:969:27)>_>
  *location;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_48;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:969:27)>
  local_40;
  Own<kj::_::AttachmentPromiseNode<kj::_::Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:969:27)>_>,_kj::_::PromiseDisposer>
  local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  kj::_::NeverDone::operator_cast_to_Promise((NeverDone *)&local_48);
  local_40.maybeFunc.ptr.field_1 =
       *(anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:969:27)>_2
         *)(context.hook + 2);
  local_40.maybeFunc.ptr.isSet = true;
  pPVar1 = ((local_48.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_48.ptr - (long)pPVar1) < 0x28) {
    pvVar2 = operator_new(0x400);
    location = (AttachmentPromiseNode<kj::_::Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:969:27)>_>
                *)((long)pvVar2 + 0x3d8);
    kj::
    ctor<kj::_::AttachmentPromiseNode<kj::_::Deferred<capnp::_::(anonymous_namespace)::TestHangingTailCallee::foo(capnp::CallContext<capnproto_test::capnp::test::TestTailCallee::FooParams,capnproto_test::capnp::test::TestTailCallee::TailResult>)::_lambda()_1_>>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::_::Deferred<capnp::_::(anonymous_namespace)::TestHangingTailCallee::foo(capnp::CallContext<capnproto_test::capnp::test::TestTailCallee::FooParams,capnproto_test::capnp::test::TestTailCallee::TailResult>)::_lambda()_1_>>
              (location,&local_48,&local_40);
    *(void **)((long)pvVar2 + 0x3e0) = pvVar2;
  }
  else {
    ((local_48.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location = (AttachmentPromiseNode<kj::_::Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:969:27)>_>
                *)&local_48.ptr[-3].super_PromiseArenaMember.arena;
    kj::
    ctor<kj::_::AttachmentPromiseNode<kj::_::Deferred<capnp::_::(anonymous_namespace)::TestHangingTailCallee::foo(capnp::CallContext<capnproto_test::capnp::test::TestTailCallee::FooParams,capnproto_test::capnp::test::TestTailCallee::TailResult>)::_lambda()_1_>>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::_::Deferred<capnp::_::(anonymous_namespace)::TestHangingTailCallee::foo(capnp::CallContext<capnproto_test::capnp::test::TestTailCallee::FooParams,capnproto_test::capnp::test::TestTailCallee::TailResult>)::_lambda()_1_>>
              (location,&local_48,&local_40);
    local_48.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  local_30.ptr = (AttachmentPromiseNode<kj::_::Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_test_c__:969:27)>_>
                  *)0x0;
  (this->super_Server)._vptr_Server = (_func_int **)location;
  local_28.ptr = (PromiseNode *)0x0;
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
  kj::
  Own<kj::_::AttachmentPromiseNode<kj::_::Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:969:27)>_>,_kj::_::PromiseDisposer>
  ::~Own(&local_30);
  if (local_40.maybeFunc.ptr.isSet == true) {
    *(int *)local_40.maybeFunc.ptr.field_1 = *(int *)local_40.maybeFunc.ptr.field_1 + 1;
  }
  kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_48);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> foo(FooContext context) override {
    ++callCount;
    return kj::Promise<void>(kj::NEVER_DONE)
        .attach(kj::defer([&cancelCount = cancelCount]() { ++cancelCount; }));
  }